

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcomapi.c
# Opt level: O0

void jpeg_destroy(j_common_ptr cinfo)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    (**(code **)(*(long *)(in_RDI + 8) + 0x50))(in_RDI);
  }
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  return;
}

Assistant:

GLOBAL(void)
jpeg_destroy(j_common_ptr cinfo)
{
  /* We need only tell the memory manager to release everything. */
  /* NB: mem pointer is NULL if memory mgr failed to initialize. */
  if (cinfo->mem != NULL)
    (*cinfo->mem->self_destruct) (cinfo);
  cinfo->mem = NULL;            /* be safe if jpeg_destroy is called twice */
  cinfo->global_state = 0;      /* mark it destroyed */
}